

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

S1Interval __thiscall S1Interval::Union(S1Interval *this,S1Interval *y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double b;
  double dhi;
  double dlo;
  S1Interval *y_local;
  S1Interval *this_local;
  
  bVar1 = is_empty(y);
  if (bVar1) {
    _this_local = *(S1Interval *)(this->bounds_).c_;
  }
  else {
    dVar2 = lo(y);
    bVar1 = FastContains(this,dVar2);
    if (bVar1) {
      dVar2 = hi(y);
      bVar1 = FastContains(this,dVar2);
      if (bVar1) {
        bVar1 = Contains(this,y);
        if (bVar1) {
          _this_local = *(S1Interval *)(this->bounds_).c_;
        }
        else {
          _this_local = Full();
        }
      }
      else {
        dVar2 = lo(this);
        dVar3 = hi(y);
        S1Interval((S1Interval *)&this_local,dVar2,dVar3,ARGS_CHECKED);
      }
    }
    else {
      dVar2 = hi(y);
      bVar1 = FastContains(this,dVar2);
      if (bVar1) {
        dVar2 = lo(y);
        dVar3 = hi(this);
        S1Interval((S1Interval *)&this_local,dVar2,dVar3,ARGS_CHECKED);
      }
      else {
        bVar1 = is_empty(this);
        if (!bVar1) {
          dVar2 = lo(this);
          bVar1 = FastContains(y,dVar2);
          if (!bVar1) {
            dVar2 = hi(y);
            dVar3 = lo(this);
            dVar2 = PositiveDistance(dVar2,dVar3);
            dVar3 = hi(this);
            b = lo(y);
            dVar3 = PositiveDistance(dVar3,b);
            if (dVar2 < dVar3) {
              dVar2 = lo(y);
              dVar3 = hi(this);
              S1Interval((S1Interval *)&this_local,dVar2,dVar3,ARGS_CHECKED);
              return (Vector2_d)_this_local;
            }
            dVar2 = lo(this);
            dVar3 = hi(y);
            S1Interval((S1Interval *)&this_local,dVar2,dVar3,ARGS_CHECKED);
            return (Vector2_d)_this_local;
          }
        }
        _this_local = *(S1Interval *)(y->bounds_).c_;
      }
    }
  }
  return (Vector2_d)(Vector2_d)_this_local;
}

Assistant:

S1Interval S1Interval::Union(const S1Interval& y) const {
  // The y.is_full() case is handled correctly in all cases by the code
  // below, but can follow three separate code paths depending on whether
  // this interval is inverted, is non-inverted but contains Pi, or neither.

  if (y.is_empty()) return *this;
  if (FastContains(y.lo())) {
    if (FastContains(y.hi())) {
      // Either this interval contains y, or the union of the two
      // intervals is the Full() interval.
      if (Contains(y)) return *this;  // is_full() code path
      return Full();
    }
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
  if (FastContains(y.hi())) return S1Interval(y.lo(), hi(), ARGS_CHECKED);

  // This interval contains neither endpoint of y.  This means that either y
  // contains all of this interval, or the two intervals are disjoint.
  if (is_empty() || y.FastContains(lo())) return y;

  // Check which pair of endpoints are closer together.
  double dlo = PositiveDistance(y.hi(), lo());
  double dhi = PositiveDistance(hi(), y.lo());
  if (dlo < dhi) {
    return S1Interval(y.lo(), hi(), ARGS_CHECKED);
  } else {
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
}